

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

bool __thiscall
RtApiPulse::probeDeviceOpen
          (RtApiPulse *this,uint deviceId,StreamMode mode,uint channels,uint firstChannel,
          uint sampleRate,RtAudioFormat format,uint *bufferSize,StreamOptions *options)

{
  CallbackInfo *__arg;
  pointer pPVar1;
  StreamMode SVar2;
  pointer pDVar3;
  pointer pPVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  undefined8 *puVar12;
  int *piVar13;
  char *pcVar14;
  rtaudio_pa_format_mapping_t *prVar15;
  bool bVar16;
  RtAudioFormat RVar17;
  ulong uVar18;
  _Alloc_hider _Var19;
  pointer pcVar20;
  long *plVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  int error;
  pa_sample_format_t local_b4;
  uint local_b0;
  undefined1 local_ac;
  string streamName;
  sched_param param;
  int local_7c [5];
  pthread_attr_t attr;
  
  pDVar3 = (this->super_RtApi).deviceList_.
           super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar23 = 0;
  lVar10 = (long)(this->super_RtApi).deviceList_.
                 super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pDVar3;
  if (lVar10 != 0) {
    uVar18 = (lVar10 >> 5) * -0x5555555555555555;
    do {
      uVar22 = (uint)uVar23;
      if (pDVar3[uVar23].ID == deviceId) {
        if (-1 < (int)uVar22) {
          if (firstChannel == 0) {
            pPVar4 = (this->paDeviceList_).
                     super__Vector_base<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPVar1 = pPVar4 + uVar23;
            if (pPVar4[uVar23].sourceName._M_string_length == 0) {
              pcVar20 = (pointer)0x0;
            }
            else {
              pcVar20 = (pPVar1->sourceName)._M_dataplus._M_p;
            }
            if ((pPVar1->sinkName)._M_string_length == 0) {
              _Var19._M_p = (pointer)0x0;
            }
            else {
              _Var19._M_p = (pPVar1->sinkName)._M_dataplus._M_p;
            }
            if (mode == INPUT) {
              if (channels <= pDVar3[uVar23].inputChannels) goto LAB_001109d7;
              pcVar11 = (char *)(this->super_RtApi).errorText_._M_string_length;
              pcVar14 = "PulseAudio device does not support requested input channel count.";
            }
            else {
              if ((mode != OUTPUT) || (channels <= pDVar3[uVar23].outputChannels)) {
LAB_001109d7:
                local_ac = (undefined1)channels;
                (this->super_RtApi).stream_.sampleRate = sampleRate;
                RVar17 = 2;
                prVar15 = supported_sampleformats;
                goto LAB_001109f3;
              }
              pcVar11 = (char *)(this->super_RtApi).errorText_._M_string_length;
              pcVar14 = "PulseAudio device does not support requested output channel count.";
            }
          }
          else {
            pcVar11 = (char *)(this->super_RtApi).errorText_._M_string_length;
            pcVar14 = "PulseAudio does not support channel offset mapping.";
          }
          uVar23 = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_RtApi).errorText_,0,pcVar11,(ulong)pcVar14);
          goto LAB_00110923;
        }
        break;
      }
      uVar23 = (ulong)(uVar22 + 1);
    } while (uVar23 <= uVar18 && uVar18 - uVar23 != 0);
    uVar23 = 0;
  }
  goto LAB_00110923;
  while( true ) {
    RVar17 = prVar15->rtaudio_format;
    if (RVar17 == 0) break;
LAB_001109f3:
    prVar15 = prVar15 + 1;
    if (RVar17 == format) {
      local_b4 = prVar15[-1].pa_format;
      RVar17 = format;
      goto LAB_00110a16;
    }
  }
  local_b4 = PA_SAMPLE_FLOAT32LE;
  RVar17 = 0x10;
LAB_00110a16:
  (this->super_RtApi).stream_.userFormat = format;
  (this->super_RtApi).stream_.deviceFormat[mode] = RVar17;
  if (options == (StreamOptions *)0x0) {
    (this->super_RtApi).stream_.userInterleaved = true;
    (this->super_RtApi).stream_.deviceInterleaved[mode] = true;
    uVar5 = 1;
  }
  else {
    (this->super_RtApi).stream_.userInterleaved = (bool)(~(byte)options->flags & 1);
    (this->super_RtApi).stream_.deviceInterleaved[mode] = true;
    uVar5 = options->numberOfBuffers;
  }
  (this->super_RtApi).stream_.nBuffers = uVar5;
  (this->super_RtApi).stream_.doByteSwap[mode] = false;
  (this->super_RtApi).stream_.nUserChannels[mode] = channels;
  (this->super_RtApi).stream_.nDeviceChannels[mode] = channels;
  (this->super_RtApi).stream_.channelOffset[mode] = 0;
  streamName._M_dataplus._M_p = (pointer)&streamName.field_2;
  local_b0 = sampleRate;
  std::__cxx11::string::_M_construct<char_const*>((string *)&streamName,"RtAudio","");
  bVar24 = (this->super_RtApi).stream_.userFormat != (this->super_RtApi).stream_.deviceFormat[mode];
  (this->super_RtApi).stream_.doConvertBuffer[mode] = bVar24;
  bVar24 = (this->super_RtApi).stream_.nUserChannels[mode] <
           (this->super_RtApi).stream_.nDeviceChannels[mode] || bVar24;
  (this->super_RtApi).stream_.doConvertBuffer[mode] = bVar24;
  (this->super_RtApi).stream_.doConvertBuffer[mode] =
       (this->super_RtApi).stream_.userInterleaved !=
       (this->super_RtApi).stream_.deviceInterleaved[mode] || bVar24;
  uVar5 = (this->super_RtApi).stream_.nUserChannels[mode];
  uVar7 = *bufferSize;
  uVar6 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.userFormat);
  uVar23 = (ulong)(uVar7 * uVar5 * uVar6);
  pcVar11 = (char *)calloc(uVar23,1);
  (this->super_RtApi).stream_.userBuffer[mode] = pcVar11;
  if (pcVar11 == (char *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_RtApi).errorText_,0,
               (char *)(this->super_RtApi).errorText_._M_string_length,0x11641c);
LAB_00110fbe:
    lVar10 = 0;
    bVar24 = true;
    do {
      bVar16 = bVar24;
      pcVar11 = (this->super_RtApi).stream_.userBuffer[lVar10];
      if (pcVar11 != (char *)0x0) {
        free(pcVar11);
        (this->super_RtApi).stream_.userBuffer[lVar10] = (char *)0x0;
      }
      lVar10 = 1;
      bVar24 = false;
    } while (bVar16);
    pcVar11 = (this->super_RtApi).stream_.deviceBuffer;
    if (pcVar11 != (char *)0x0) {
      free(pcVar11);
      (this->super_RtApi).stream_.deviceBuffer = (char *)0x0;
    }
    (this->super_RtApi).stream_.state = STREAM_CLOSED;
    uVar23 = 0;
  }
  else {
    (this->super_RtApi).stream_.bufferSize = *bufferSize;
    if ((this->super_RtApi).stream_.doConvertBuffer[mode] == true) {
      uVar5 = (this->super_RtApi).stream_.nDeviceChannels[mode];
      uVar7 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.deviceFormat[mode]);
      uVar7 = uVar7 * uVar5;
      uVar23 = (ulong)uVar7;
      pcVar11 = (this->super_RtApi).stream_.deviceBuffer;
      if (pcVar11 != (char *)0x0 && (mode == INPUT && (this->super_RtApi).stream_.mode == OUTPUT)) {
        uVar5 = (this->super_RtApi).stream_.nDeviceChannels[0];
        uVar6 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.deviceFormat[0]);
        if (uVar7 <= uVar6 * uVar5) goto LAB_00110c45;
        pcVar11 = (this->super_RtApi).stream_.deviceBuffer;
      }
      uVar23 = *bufferSize * uVar23;
      if (pcVar11 != (char *)0x0) {
        free(pcVar11);
      }
      pcVar11 = (char *)calloc(uVar23,1);
      (this->super_RtApi).stream_.deviceBuffer = pcVar11;
      if (pcVar11 == (char *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error allocating device buffer memory.");
        goto LAB_00110fbe;
      }
    }
LAB_00110c45:
    (this->super_RtApi).stream_.deviceId[mode] = uVar22;
    if ((this->super_RtApi).stream_.doConvertBuffer[mode] == true) {
      RtApi::setConvertInfo(&this->super_RtApi,mode,0);
    }
    plVar21 = (long *)(this->super_RtApi).stream_.apiHandle;
    if (plVar21 == (long *)0x0) {
      puVar12 = (undefined8 *)operator_new(0x50);
      *(undefined1 *)(puVar12 + 9) = 0;
      *puVar12 = 0;
      puVar12[1] = 0;
      (this->super_RtApi).stream_.apiHandle = puVar12;
      iVar9 = pthread_cond_init((pthread_cond_t *)(puVar12 + 3),(pthread_condattr_t *)0x0);
      if (iVar9 != 0) {
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error creating condition variable.");
        goto LAB_00110fbe;
      }
      plVar21 = (long *)(this->super_RtApi).stream_.apiHandle;
    }
    if ((options != (StreamOptions *)0x0) && ((options->streamName)._M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&streamName);
    }
    iVar9 = (int)uVar23;
    if (mode != OUTPUT) {
      if (mode == DUPLEX) {
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: duplex not supported for PulseAudio.");
      }
      else if (mode == INPUT) {
        if ((options == (StreamOptions *)0x0) || (options->numberOfBuffers == 0)) {
          local_7c[0] = iVar9 << 2;
        }
        else {
          local_7c[0] = (options->numberOfBuffers + 1) * iVar9;
        }
        local_7c[4] = iVar9;
        lVar10 = pa_simple_new(0,streamName._M_dataplus._M_p,2,pcVar20,"Record",&local_b4,0,local_7c
                               ,&error);
        plVar21[1] = lVar10;
        if (lVar10 != 0) goto LAB_00110e23;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error connecting input to PulseAudio server.");
        goto LAB_00110f99;
      }
      if (plVar21 != (long *)0x0) goto LAB_00110f99;
      goto LAB_00110fbe;
    }
    if ((options == (StreamOptions *)0x0) || (options->numberOfBuffers == 0)) {
      piVar13 = (int *)0x0;
    }
    else {
      local_7c[0] = options->numberOfBuffers * iVar9;
      piVar13 = local_7c;
      local_7c[3] = 0xffffffff;
      local_7c[1] = -1;
      local_7c[2] = -1;
    }
    lVar10 = pa_simple_new(0,streamName._M_dataplus._M_p,1,_Var19._M_p,"Playback",&local_b4,0,
                           piVar13,&error);
    *plVar21 = lVar10;
    if (lVar10 == 0) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_RtApi).errorText_,
                 "RtApiPulse::probeDeviceOpen: error connecting output to PulseAudio server.");
LAB_00110f99:
      if ((this->super_RtApi).stream_.callbackInfo.isRunning == true) {
        pthread_cond_destroy((pthread_cond_t *)(plVar21 + 3));
        operator_delete(plVar21);
        (this->super_RtApi).stream_.apiHandle = (void *)0x0;
      }
      goto LAB_00110fbe;
    }
LAB_00110e23:
    SVar2 = (this->super_RtApi).stream_.mode;
    if ((SVar2 != UNINITIALIZED) && (bVar24 = SVar2 == mode, mode = DUPLEX, bVar24))
    goto LAB_00110f99;
    (this->super_RtApi).stream_.mode = mode;
    uVar23 = 1;
    if ((this->super_RtApi).stream_.callbackInfo.isRunning == false) {
      __arg = &(this->super_RtApi).stream_.callbackInfo;
      (this->super_RtApi).stream_.callbackInfo.object = this;
      (this->super_RtApi).stream_.state = STREAM_STOPPED;
      pthread_attr_init((pthread_attr_t *)&attr);
      pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
      if ((options == (StreamOptions *)0x0) || ((options->flags & 8) == 0)) {
        pthread_attr_setschedpolicy((pthread_attr_t *)&attr,0);
      }
      else {
        (this->super_RtApi).stream_.callbackInfo.doRealtime = true;
        iVar9 = options->priority;
        iVar8 = sched_get_priority_min(2);
        param.sched_priority = sched_get_priority_max(2);
        if (iVar9 < param.sched_priority) {
          param.sched_priority = iVar9;
        }
        if (iVar9 < iVar8) {
          param.sched_priority = iVar8;
        }
        pthread_attr_setschedpolicy((pthread_attr_t *)&attr,2);
        pthread_attr_setscope((pthread_attr_t *)&attr,0);
        pthread_attr_setinheritsched((pthread_attr_t *)&attr,1);
        pthread_attr_setschedparam((pthread_attr_t *)&attr,(sched_param *)&param);
      }
      (this->super_RtApi).stream_.callbackInfo.isRunning = true;
      iVar9 = pthread_create((pthread_t *)(plVar21 + 2),(pthread_attr_t *)&attr,pulseaudio_callback,
                             __arg);
      pthread_attr_destroy((pthread_attr_t *)&attr);
      if ((iVar9 != 0) &&
         (iVar9 = pthread_create((pthread_t *)(plVar21 + 2),(pthread_attr_t *)0x0,
                                 pulseaudio_callback,__arg), iVar9 != 0)) {
        (this->super_RtApi).stream_.callbackInfo.isRunning = false;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error creating thread.");
        goto LAB_00110f99;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)streamName._M_dataplus._M_p != &streamName.field_2) {
    operator_delete(streamName._M_dataplus._M_p);
  }
LAB_00110923:
  return SUB81(uVar23,0);
}

Assistant:

bool RtApiPulse::probeDeviceOpen( unsigned int deviceId, StreamMode mode,
                                  unsigned int channels, unsigned int firstChannel,
                                  unsigned int sampleRate, RtAudioFormat format,
                                  unsigned int *bufferSize, RtAudio::StreamOptions *options )
{
  PulseAudioHandle *pah = 0;
  unsigned long bufferBytes = 0;
  pa_sample_spec ss;

  int deviceIdx = -1;
  for ( unsigned int m=0; m<deviceList_.size(); m++ ) {
    if ( deviceList_[m].ID == deviceId ) {
      deviceIdx = m;
      break;
    }
  }

  if ( deviceIdx < 0 ) return false;

  if ( firstChannel != 0 ) {
    errorText_ = "PulseAudio does not support channel offset mapping.";
    return false;
  }

  // These may be NULL for default devices but we already have the names.
  const char *dev_input = NULL;
  const char *dev_output = NULL;
  if ( !paDeviceList_[deviceIdx].sourceName.empty() )
    dev_input = paDeviceList_[deviceIdx].sourceName.c_str();
  if ( !paDeviceList_[deviceIdx].sinkName.empty() )
    dev_output = paDeviceList_[deviceIdx].sinkName.c_str();

  if ( mode==INPUT && deviceList_[deviceIdx].inputChannels < channels ) {
    errorText_ = "PulseAudio device does not support requested input channel count.";
    return false;
  }
  if ( mode==OUTPUT && deviceList_[deviceIdx].outputChannels < channels ) {
    errorText_ = "PulseAudio device does not support requested output channel count.";
    return false;
  }

  ss.channels = channels;

  bool sr_found = false;
  for ( const unsigned int *sr = SUPPORTED_SAMPLERATES; *sr; ++sr ) {
    if ( sampleRate == *sr ) {
      sr_found = true;
      stream_.sampleRate = sampleRate;
      ss.rate = sampleRate;
      break;
    }
  }
  if ( !sr_found ) {
    stream_.sampleRate = sampleRate;
    ss.rate = sampleRate;
  }

  bool sf_found = 0;
  for ( const rtaudio_pa_format_mapping_t *sf = supported_sampleformats;
        sf->rtaudio_format && sf->pa_format != PA_SAMPLE_INVALID; ++sf ) {
    if ( format == sf->rtaudio_format ) {
      sf_found = true;
      stream_.userFormat = sf->rtaudio_format;
      stream_.deviceFormat[mode] = stream_.userFormat;
      ss.format = sf->pa_format;
      break;
    }
  }
  if ( !sf_found ) { // Use internal data format conversion.
    stream_.userFormat = format;
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT32;
    ss.format = PA_SAMPLE_FLOAT32LE;
  }

  // Set other stream parameters.
  if ( options && options->flags & RTAUDIO_NONINTERLEAVED ) stream_.userInterleaved = false;
  else stream_.userInterleaved = true;
  stream_.deviceInterleaved[mode] = true;
  stream_.nBuffers = options ? options->numberOfBuffers : 1;
  stream_.doByteSwap[mode] = false;
  stream_.nUserChannels[mode] = channels;
  stream_.nDeviceChannels[mode] = channels + firstChannel;
  stream_.channelOffset[mode] = 0;
  std::string streamName = "RtAudio";

  // Set flags for buffer conversion.
  stream_.doConvertBuffer[mode] = false;
  if ( stream_.userFormat != stream_.deviceFormat[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.nUserChannels[mode] < stream_.nDeviceChannels[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.userInterleaved != stream_.deviceInterleaved[mode] )
    stream_.doConvertBuffer[mode] = true;

  // Allocate necessary internal buffers.
  bufferBytes = stream_.nUserChannels[mode] * *bufferSize * formatBytes( stream_.userFormat );
  stream_.userBuffer[mode] = (char *) calloc( bufferBytes, 1 );
  if ( stream_.userBuffer[mode] == NULL ) {
    errorText_ = "RtApiPulse::probeDeviceOpen: error allocating user buffer memory.";
    goto error;
  }
  stream_.bufferSize = *bufferSize;

  if ( stream_.doConvertBuffer[mode] ) {

    bool makeBuffer = true;
    bufferBytes = stream_.nDeviceChannels[mode] * formatBytes( stream_.deviceFormat[mode] );
    if ( mode == INPUT ) {
      if ( stream_.mode == OUTPUT && stream_.deviceBuffer ) {
        unsigned long bytesOut = stream_.nDeviceChannels[0] * formatBytes( stream_.deviceFormat[0] );
        if ( bufferBytes <= bytesOut ) makeBuffer = false;
      }
    }

    if ( makeBuffer ) {
      bufferBytes *= *bufferSize;
      if ( stream_.deviceBuffer ) free( stream_.deviceBuffer );
      stream_.deviceBuffer = (char *) calloc( bufferBytes, 1 );
      if ( stream_.deviceBuffer == NULL ) {
        errorText_ = "RtApiPulse::probeDeviceOpen: error allocating device buffer memory.";
        goto error;
      }
    }
  }

  stream_.deviceId[mode] = deviceIdx;

  // Setup the buffer conversion information structure.
  if ( stream_.doConvertBuffer[mode] ) setConvertInfo( mode, firstChannel );

  if ( !stream_.apiHandle ) {
    PulseAudioHandle *pah = new PulseAudioHandle;
    if ( !pah ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error allocating memory for handle.";
      goto error;
    }

    stream_.apiHandle = pah;
    if ( pthread_cond_init( &pah->runnable_cv, NULL ) != 0 ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error creating condition variable.";
      goto error;
    }
  }
  pah = static_cast<PulseAudioHandle *>( stream_.apiHandle );

  int error;
  if ( options && !options->streamName.empty() ) streamName = options->streamName;
  switch ( mode ) {
    pa_buffer_attr buffer_attr;
  case INPUT:
    buffer_attr.fragsize = bufferBytes;
    if ( options && options->numberOfBuffers > 0 )
      buffer_attr.maxlength = bufferBytes * (options->numberOfBuffers + 1);
    else
      buffer_attr.maxlength = bufferBytes * 4;

    pah->s_rec = pa_simple_new( NULL, streamName.c_str(), PA_STREAM_RECORD,
                                dev_input, "Record", &ss, NULL, &buffer_attr, &error );
    if ( !pah->s_rec ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error connecting input to PulseAudio server.";
      goto error;
    }
    break;
  case OUTPUT: {
    pa_buffer_attr * attr_ptr;

    if ( options && options->numberOfBuffers > 0 ) {
      // pa_buffer_attr::fragsize is recording-only.
      // Hopefully PortAudio won't access uninitialized fields.
      buffer_attr.maxlength = bufferBytes * options->numberOfBuffers;
      buffer_attr.minreq = -1;
      buffer_attr.prebuf = -1;
      buffer_attr.tlength = -1;
      attr_ptr = &buffer_attr;
    } else {
      attr_ptr = nullptr;
    }

    pah->s_play = pa_simple_new( NULL, streamName.c_str(), PA_STREAM_PLAYBACK,
                                 dev_output, "Playback", &ss, NULL, attr_ptr, &error );
    if ( !pah->s_play ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error connecting output to PulseAudio server.";
      goto error;
    }
    break;
  }
  case DUPLEX:
    /* Note: We could add DUPLEX by synchronizing multiple streams,
       but it would mean moving from Simple API to Asynchronous API:
       https://freedesktop.org/software/pulseaudio/doxygen/streams.html#sync_streams */
    errorText_ = "RtApiPulse::probeDeviceOpen: duplex not supported for PulseAudio.";
    goto error;
  default:
    goto error;
  }

  if ( stream_.mode == UNINITIALIZED )
    stream_.mode = mode;
  else if ( stream_.mode == mode )
    goto error;
  else
    stream_.mode = DUPLEX;

  if ( !stream_.callbackInfo.isRunning ) {
    stream_.callbackInfo.object = this;
    
    stream_.state = STREAM_STOPPED;
    // Set the thread attributes for joinable and realtime scheduling
    // priority (optional).  The higher priority will only take affect
    // if the program is run as root or suid. Note, under Linux
    // processes with CAP_SYS_NICE privilege, a user can change
    // scheduling policy and priority (thus need not be root). See
    // POSIX "capabilities".
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
    if ( options && options->flags & RTAUDIO_SCHEDULE_REALTIME ) {
      stream_.callbackInfo.doRealtime = true;
      struct sched_param param;
      int priority = options->priority;
      int min = sched_get_priority_min( SCHED_RR );
      int max = sched_get_priority_max( SCHED_RR );
      if ( priority < min ) priority = min;
      else if ( priority > max ) priority = max;
      param.sched_priority = priority;
      
      // Set the policy BEFORE the priority. Otherwise it fails.
      pthread_attr_setschedpolicy(&attr, SCHED_RR);
      pthread_attr_setscope (&attr, PTHREAD_SCOPE_SYSTEM);
      // This is definitely required. Otherwise it fails.
      pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED);
      pthread_attr_setschedparam(&attr, &param);
    }
    else
      pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#else
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#endif

    stream_.callbackInfo.isRunning = true;
    int result = pthread_create( &pah->thread, &attr, pulseaudio_callback, (void *)&stream_.callbackInfo);
    pthread_attr_destroy(&attr);
    if(result != 0) {
      // Failed. Try instead with default attributes.
      result = pthread_create( &pah->thread, NULL, pulseaudio_callback, (void *)&stream_.callbackInfo);
      if(result != 0) {
        stream_.callbackInfo.isRunning = false;
        errorText_ = "RtApiPulse::probeDeviceOpen: error creating thread.";
        goto error;
      }
    }
  }

  return SUCCESS;
 
 error:
  if ( pah && stream_.callbackInfo.isRunning ) {
    pthread_cond_destroy( &pah->runnable_cv );
    delete pah;
    stream_.apiHandle = 0;
  }

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  stream_.state = STREAM_CLOSED;
  return FAILURE;
}